

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

void __thiscall XMLParser::XMLNode::deleteAttribute(XMLNode *this,int i)

{
  int iVar1;
  XMLNodeData *pXVar2;
  XMLAttribute *pXVar3;
  
  pXVar2 = this->d;
  if (-1 < i && pXVar2 != (XMLNodeData *)0x0) {
    if (i < pXVar2->nAttribute) {
      pXVar2->nAttribute = pXVar2->nAttribute + -1;
      pXVar3 = pXVar2->pAttribute;
      free(pXVar3[(uint)i].lpszName);
      if (pXVar3[(uint)i].lpszValue != (char *)0x0) {
        free(pXVar3[(uint)i].lpszValue);
      }
      pXVar3 = pXVar3 + (uint)i;
      iVar1 = this->d->nAttribute;
      if (iVar1 != 0) {
        memmove(pXVar3,pXVar3 + 1,(long)(iVar1 - i) << 4);
        return;
      }
      free(pXVar3);
      this->d->pAttribute = (XMLAttribute *)0x0;
    }
  }
  return;
}

Assistant:

void XMLNode::deleteAttribute(int i)
    {
        if((!d) || (i < 0) || (i >= d->nAttribute))
            return;
        d->nAttribute--;
        XMLAttribute * p = d->pAttribute + i;
        free((void *)p->lpszName);
        if(p->lpszValue)
            free((void *)p->lpszValue);
        if(d->nAttribute)
            memmove(p, p + 1, (d->nAttribute - i) * sizeof(XMLAttribute));
        else
        {
            free(p);
            d->pAttribute = NULL;
        }
    }